

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagonal_precond.cc
# Opt level: O0

void __thiscall ipx::DiagonalPrecond::Factorize(DiagonalPrecond *this,double *W,Info *info)

{
  Int IVar1;
  Int IVar2;
  SparseMatrix *this_00;
  double *pdVar3;
  char *pcVar4;
  int __c;
  int __c_00;
  long in_RSI;
  long in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  Int p_1;
  Int j_1;
  Int p;
  double w;
  Int j;
  Int i;
  SparseMatrix *AI;
  Int n;
  Int m;
  undefined4 in_stack_ffffffffffffff58;
  Int in_stack_ffffffffffffff5c;
  SparseMatrix *in_stack_ffffffffffffff60;
  uint local_50;
  int local_4c;
  uint local_3c;
  int local_30;
  int local_2c;
  
  IVar1 = Model::rows(*(Model **)(in_RDI + 8));
  IVar2 = Model::cols(*(Model **)(in_RDI + 8));
  this_00 = Model::AI(*(Model **)(in_RDI + 8));
  *(undefined1 *)(in_RDI + 0x10) = 0;
  if (in_RSI == 0) {
    std::valarray<double>::operator=
              ((valarray<double> *)in_stack_ffffffffffffff60,
               (double *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    for (local_4c = 0; local_4c < IVar2; local_4c = local_4c + 1) {
      for (local_50 = SparseMatrix::begin(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          IVar1 = SparseMatrix::end(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
          (int)local_50 < IVar1; local_50 = local_50 + 1) {
        dVar7 = SparseMatrix::value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        dVar5 = SparseMatrix::value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        in_stack_ffffffffffffff60 = (SparseMatrix *)(in_RDI + 0x18);
        pcVar4 = SparseMatrix::index(this_00,(char *)(ulong)local_50,__c_00);
        pdVar3 = std::valarray<double>::operator[]
                           ((valarray<double> *)in_stack_ffffffffffffff60,(long)(int)pcVar4);
        *pdVar3 = dVar7 * dVar5 + *pdVar3;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < IVar1; local_2c = local_2c + 1) {
      dVar7 = *(double *)(in_RSI + (long)(IVar2 + local_2c) * 8);
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x18),(long)local_2c)
      ;
      *pdVar3 = dVar7;
    }
    for (local_30 = 0; local_30 < IVar2; local_30 = local_30 + 1) {
      dVar7 = *(double *)(in_RSI + (long)local_30 * 8);
      for (local_3c = SparseMatrix::begin(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          IVar1 = SparseMatrix::end(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
          (int)local_3c < IVar1; local_3c = local_3c + 1) {
        dVar5 = SparseMatrix::value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        dVar6 = SparseMatrix::value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        pcVar4 = SparseMatrix::index(this_00,(char *)(ulong)local_3c,__c);
        pdVar3 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0x18),(long)(int)pcVar4);
        *pdVar3 = dVar5 * dVar7 * dVar6 + *pdVar3;
      }
    }
  }
  *(undefined1 *)(in_RDI + 0x10) = 1;
  return;
}

Assistant:

void DiagonalPrecond::Factorize(const double* W, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();

    factorized_ = false;

    // Build diagonal of normal matrix.
    if (W) {
        for (Int i = 0; i < m; i++)
            diagonal_[i] = W[n+i];
        for (Int j = 0; j < n; j++) {
            double w = W[j];
            for (Int p = AI.begin(j); p < AI.end(j); p++)
                diagonal_[AI.index(p)] += AI.value(p) * w * AI.value(p);
        }
    } else {
        diagonal_ = 0.0;        // rightmost m columns have weight zero
        for (Int j = 0; j < n; j++) {
            for (Int p = AI.begin(j); p < AI.end(j); p++)
                diagonal_[AI.index(p)] += AI.value(p) * AI.value(p);
        }
    }

    factorized_ = true;
}